

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_accessors.c
# Opt level: O1

uint32_t aec_get_lsb_24(aec_stream *strm)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  
  pbVar4 = strm->next_in;
  bVar1 = pbVar4[2];
  bVar2 = pbVar4[1];
  bVar3 = *pbVar4;
  strm->next_in = pbVar4 + 3;
  strm->avail_in = strm->avail_in - 3;
  return (uint)bVar3 | (uint)bVar2 << 8 | (uint)bVar1 << 0x10;
}

Assistant:

uint32_t aec_get_lsb_24(struct aec_stream *strm)
{
    uint32_t data = ((uint32_t)strm->next_in[2] << 16)
        | ((uint32_t)strm->next_in[1] << 8)
        | (uint32_t)strm->next_in[0];

    strm->next_in += 3;
    strm->avail_in -= 3;
    return data;
}